

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader.cc
# Opt level: O0

bool __thiscall wabt::anon_unknown_24::BinaryReader::IsConcreteType(BinaryReader *this,Type type)

{
  Enum EVar1;
  BinaryReader *this_local;
  Type type_local;
  
  unique0x10000082 = type;
  EVar1 = Type::operator_cast_to_Enum((Type *)((long)&this_local + 4));
  switch(EVar1) {
  case Reference:
    type_local.enum_._3_1_ = Features::function_references_enabled(&this->options_->features);
    break;
  default:
    type_local.enum_._3_1_ = Any >> 0x18;
    break;
  case ExternRef:
  case FuncRef:
    type_local.enum_._3_1_ = Features::reference_types_enabled(&this->options_->features);
    break;
  case V128:
    type_local.enum_._3_1_ = Features::simd_enabled(&this->options_->features);
    break;
  case F64:
  case F32:
  case I64:
  case I32:
    type_local.enum_._3_1_ = 1;
  }
  return (bool)type_local.enum_._3_1_;
}

Assistant:

bool BinaryReader::IsConcreteType(Type type) {
  switch (type) {
    case Type::I32:
    case Type::I64:
    case Type::F32:
    case Type::F64:
      return true;

    case Type::V128:
      return options_.features.simd_enabled();

    case Type::FuncRef:
    case Type::ExternRef:
      return options_.features.reference_types_enabled();

    case Type::Reference:
      return options_.features.function_references_enabled();

    default:
      return false;
  }
}